

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<char> * __thiscall
kj::Array<unsigned_char>::releaseAsChars
          (Array<char> *__return_storage_ptr__,Array<unsigned_char> *this)

{
  Array<unsigned_char> *this_local;
  Array<char> *result;
  
  if (this->disposer == (ArrayDisposer *)0x0) {
    Array<char>::Array(__return_storage_ptr__,(void *)0x0);
  }
  else {
    Array<char>::Array(__return_storage_ptr__,(char *)this->ptr,this->size_,this->disposer);
    this->ptr = (uchar *)0x0;
    this->size_ = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Array<PropagateConst<T, char>> releaseAsChars() {
    // Like asChars() but transfers ownership.
    static_assert(sizeof(T) == sizeof(PropagateConst<T, char>),
        "releaseAsChars() only possible on arrays with char-size elements (e.g. bytes).");
    if (disposer == nullptr) return nullptr;
    Array<PropagateConst<T, char>> result(
        reinterpret_cast<PropagateConst<T, char>*>(ptr), size_, *disposer);
    ptr = nullptr;
    size_ = 0;
    return result;
  }